

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O2

void __thiscall TEST_SimpleString_Booleans_Test::testBody(TEST_SimpleString_Booleans_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_40;
  SimpleString s2;
  SimpleString s1;
  
  StringFrom(SUB81(&s1,0));
  StringFrom(SUB81(&s2,0));
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_40,"true");
  bVar1 = operator==(&s1,&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s1 == \"true\"",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x256,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_40,"false");
  bVar1 = operator==(&s2,&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s2 == \"false\"",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,599,pTVar3);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&s2);
  SimpleString::~SimpleString(&s1);
  return;
}

Assistant:

TEST(SimpleString, Booleans)
{
    SimpleString s1(StringFrom(true));
    SimpleString s2(StringFrom(false));
    CHECK(s1 == "true");
    CHECK(s2 == "false");
}